

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Distance.cpp
# Opt level: O0

double Distance::getRobinsonFouldsDistance
                 (string *t1,string *t2,bool normalise,bool rooted1,bool rooted2)

{
  byte in_CL;
  byte in_DL;
  string *in_RSI;
  string *in_RDI;
  byte in_R8B;
  double dVar1;
  PhyloTree b;
  PhyloTree a;
  undefined1 in_stack_00000417;
  string *in_stack_00000418;
  PhyloTree *in_stack_00000420;
  PhyloTree *this;
  string local_138 [63];
  undefined1 in_stack_ffffffffffffff07;
  PhyloTree *in_stack_ffffffffffffff08;
  PhyloTree *in_stack_ffffffffffffff10;
  PhyloTree local_a0;
  byte local_13;
  byte local_12;
  byte local_11;
  string *local_10;
  
  local_11 = in_DL & 1;
  local_12 = in_CL & 1;
  local_13 = in_R8B & 1;
  this = &local_a0;
  local_10 = in_RSI;
  std::__cxx11::string::string((string *)this,in_RDI);
  PhyloTree::PhyloTree(in_stack_00000420,in_stack_00000418,(bool)in_stack_00000417);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string(local_138,local_10);
  PhyloTree::PhyloTree(in_stack_00000420,in_stack_00000418,(bool)in_stack_00000417);
  std::__cxx11::string::~string(local_138);
  dVar1 = getRobinsonFouldsDistance
                    (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                     (bool)in_stack_ffffffffffffff07);
  PhyloTree::~PhyloTree(this);
  PhyloTree::~PhyloTree(this);
  return dVar1;
}

Assistant:

double Distance::getRobinsonFouldsDistance(const string& t1, const string& t2, bool normalise, bool rooted1, bool rooted2) {
    PhyloTree a(t1, rooted1);
    PhyloTree b(t2, rooted2);
    return getRobinsonFouldsDistance(a, b, normalise);
}